

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_hdr_scanline(FILE *f,int width,int comp,uchar *scratch,float *scanline)

{
  int iVar1;
  bool bVar2;
  int local_58;
  int local_54;
  int len_1;
  int len;
  uchar *comp_1;
  int r;
  int c;
  int x;
  float linear [3];
  uchar rgbe [4];
  uchar scanlineheader [4];
  float *scanline_local;
  uchar *scratch_local;
  int comp_local;
  int width_local;
  FILE *f_local;
  
  linear[2] = (float)CONCAT13((char)width,CONCAT12((char)((uint)width >> 8),0x202));
  if ((width < 8) || (0x7fff < width)) {
    for (r = 0; r < width; r = r + 1) {
      if (comp - 1U < 2) {
        c = (int)scanline[r * comp];
        x = c;
        linear[0] = (float)c;
      }
      else if (comp == 3 || comp == 4) {
        linear[0] = scanline[r * comp + 2];
        x = (int)scanline[r * comp + 1];
        c = (int)scanline[r * comp];
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),(float *)&c);
      fwrite(linear + 1,4,1,(FILE *)f);
    }
  }
  else {
    for (r = 0; r < width; r = r + 1) {
      if (comp - 1U < 2) {
        c = (int)scanline[r * comp];
        x = c;
        linear[0] = (float)c;
      }
      else if (comp == 3 || comp == 4) {
        linear[0] = scanline[r * comp + 2];
        x = (int)scanline[r * comp + 1];
        c = (int)scanline[r * comp];
      }
      stbiw__linear_to_rgbe((uchar *)(linear + 1),(float *)&c);
      scratch[r] = linear[1]._0_1_;
      scratch[r + width] = linear[1]._1_1_;
      scratch[r + width * 2] = linear[1]._2_1_;
      scratch[r + width * 3] = linear[1]._3_1_;
    }
    fwrite(linear + 2,4,1,(FILE *)f);
    for (comp_1._4_4_ = 0; comp_1._4_4_ < 4; comp_1._4_4_ = comp_1._4_4_ + 1) {
      iVar1 = width * comp_1._4_4_;
      r = 0;
      while (r < width) {
        comp_1._0_4_ = r;
        while (((int)comp_1 + 2 < width &&
               ((scratch[(long)(int)comp_1 + (long)iVar1] !=
                 scratch[(long)((int)comp_1 + 1) + (long)iVar1] ||
                (scratch[(long)(int)comp_1 + (long)iVar1] !=
                 scratch[(long)((int)comp_1 + 2) + (long)iVar1]))))) {
          comp_1._0_4_ = (int)comp_1 + 1;
        }
        if (width <= (int)comp_1 + 2) {
          comp_1._0_4_ = width;
        }
        for (; r < (int)comp_1; r = local_54 + r) {
          local_54 = (int)comp_1 - r;
          if (0x80 < local_54) {
            local_54 = 0x80;
          }
          stbiw__write_dump_data(f,local_54,scratch + (long)r + (long)iVar1);
        }
        if ((int)comp_1 + 2 < width) {
          while( true ) {
            bVar2 = false;
            if ((int)comp_1 < width) {
              bVar2 = scratch[(long)(int)comp_1 + (long)iVar1] == scratch[(long)r + (long)iVar1];
            }
            if (!bVar2) break;
            comp_1._0_4_ = (int)comp_1 + 1;
          }
          for (; r < (int)comp_1; r = local_58 + r) {
            local_58 = (int)comp_1 - r;
            if (0x7f < local_58) {
              local_58 = 0x7f;
            }
            stbiw__write_run_data(f,local_58,scratch[(long)r + (long)iVar1]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(FILE *f, int width, int comp, unsigned char *scratch, const float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         fwrite(rgbe, 4, 1, f);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(comp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*comp + 2];
                    linear[1] = scanline[x*comp + 1];
                    linear[0] = scanline[x*comp + 0];
                    break;
            case 2: /* fallthrough */
            case 1: linear[0] = linear[1] = linear[2] = scanline[x*comp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      fwrite(scanlineheader, 4, 1, f);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(f, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(f, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}